

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_destroy(tsd_t *tsd,arena_t *arena)

{
  tsd_t *tsd_00;
  uint uVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  uint n_delayed;
  malloc_mutex_t *delayed_mtx [32];
  uint local_154;
  tsd_t *local_150;
  arena_t *local_148;
  ulong local_140;
  malloc_mutex_t *local_138 [33];
  
  duckdb_je_pa_shard_destroy((tsdn_t *)tsd,&arena->pa_shard);
  duckdb_je_arena_set((arena->base->ehooks).ind,(arena_t *)0x0);
  if (duckdb_je_opt_retain == false) {
    uVar2 = (ulong)(arena->base->ehooks).ind;
    local_154 = 0;
    local_150 = tsd;
    local_148 = arena;
    uVar1 = duckdb_je_narenas_total_get();
    tsd_00 = local_150;
    if (uVar1 != 0) {
      uVar4 = 0;
      local_140 = uVar2;
      do {
        if (uVar2 != uVar4) {
          pvVar3 = duckdb_je_arenas[uVar4].repr;
          if (pvVar3 == (void *)0x0) {
            pvVar3 = (void *)0x0;
          }
          if (pvVar3 != (void *)0x0) {
            arena_prepare_base_deletion_sync
                      (tsd_00,(malloc_mutex_t *)((long)pvVar3 + 0x29f8),local_138,&local_154);
            arena_prepare_base_deletion_sync
                      (tsd_00,(malloc_mutex_t *)((long)pvVar3 + 0x75e8),local_138,&local_154);
            uVar2 = local_140;
            arena_prepare_base_deletion_sync
                      (tsd_00,(malloc_mutex_t *)((long)pvVar3 + 0xc1d8),local_138,&local_154);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    tsd = local_150;
    arena_prepare_base_deletion_sync_finish(local_150,local_138,local_154);
    arena = local_148;
  }
  duckdb_je_base_delete((tsdn_t *)tsd,arena->base);
  return;
}

Assistant:

void
arena_destroy(tsd_t *tsd, arena_t *arena) {
	assert(base_ind_get(arena->base) >= narenas_auto);
	assert(arena_nthreads_get(arena, false) == 0);
	assert(arena_nthreads_get(arena, true) == 0);

	/*
	 * No allocations have occurred since arena_reset() was called.
	 * Furthermore, the caller (arena_i_destroy_ctl()) purged all cached
	 * extents, so only retained extents may remain and it's safe to call
	 * pa_shard_destroy_retained.
	 */
	pa_shard_destroy(tsd_tsdn(tsd), &arena->pa_shard);

	/*
	 * Remove the arena pointer from the arenas array.  We rely on the fact
	 * that there is no way for the application to get a dirty read from the
	 * arenas array unless there is an inherent race in the application
	 * involving access of an arena being concurrently destroyed.  The
	 * application must synchronize knowledge of the arena's validity, so as
	 * long as we use an atomic write to update the arenas array, the
	 * application will get a clean read any time after it synchronizes
	 * knowledge that the arena is no longer valid.
	 */
	arena_set(base_ind_get(arena->base), NULL);

	/*
	 * Destroy the base allocator, which manages all metadata ever mapped by
	 * this arena.  The prepare function will make sure no pending access to
	 * the metadata in this base anymore.
	 */
	arena_prepare_base_deletion(tsd, arena->base);
	base_delete(tsd_tsdn(tsd), arena->base);
}